

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_aggsig_generate_nonce
              (secp256k1_context *ctx,secp256k1_aggsig_context *aggctx,size_t index)

{
  int iVar1;
  secp256k1_rfc6979_hmac_sha256 *rng;
  secp256k1_gej pubnon;
  secp256k1_gej sStack_98;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_aggsig_generate_nonce_cold_2();
  }
  else {
    if (index < aggctx->n_sigs) {
      if (aggctx->progress[index] != NONCE_PROGRESS_UNKNOWN) {
        return 0;
      }
      rng = &aggctx->rng;
      iVar1 = secp256k1_aggsig_generate_nonce_single(ctx,aggctx->secnonce + index,&sStack_98,rng);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_gej_add_var
                (&aggctx->pubnonce_sum,&aggctx->pubnonce_sum,&sStack_98,(secp256k1_fe *)rng);
      aggctx->progress[index] = NONCE_PROGRESS_OURS;
      return 1;
    }
    secp256k1_aggsig_generate_nonce_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_aggsig_generate_nonce(const secp256k1_context* ctx, secp256k1_aggsig_context* aggctx, size_t index) {
    secp256k1_gej pubnon;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(aggctx != NULL);
    ARG_CHECK(index < aggctx->n_sigs);

    if (aggctx->progress[index] != NONCE_PROGRESS_UNKNOWN) {
        return 0;
    }
    if (secp256k1_aggsig_generate_nonce_single(ctx, &aggctx->secnonce[index], &pubnon, &aggctx->rng) == 0){
        return 0;
    }

    secp256k1_gej_add_var(&aggctx->pubnonce_sum, &aggctx->pubnonce_sum, &pubnon, NULL);
    aggctx->progress[index] = NONCE_PROGRESS_OURS;
    return 1;
}